

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QStringList * __thiscall
QIconLoader::fallbackSearchPaths(QStringList *__return_storage_ptr__,QIconLoader *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_fallbackDirs).d.size != 0) goto LAB_0025ffc9;
  if (QGuiApplicationPrivate::platform_theme == (QPlatformTheme *)0x0) {
LAB_0025ffa6:
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_68.size = 0;
  }
  else {
    local_48._16_4_ = 0xaaaaaaaa;
    local_48._20_4_ = 0xaaaaaaaa;
    uStack_30 = 0xaaaaaaaa;
    uStack_2c = 0xaaaaaaaa;
    local_48._0_4_ = 0xaaaaaaaa;
    local_48._4_4_ = 0xaaaaaaaa;
    local_48._8_4_ = 0xaaaaaaaa;
    local_48._12_4_ = 0xaaaaaaaa;
    (*QGuiApplicationPrivate::platform_theme->_vptr_QPlatformTheme[0xc])
              (&local_48,QGuiApplicationPrivate::platform_theme,0x23);
    if (CONCAT44(uStack_2c,uStack_30) < 4) {
      ::QVariant::~QVariant((QVariant *)&local_48);
      goto LAB_0025ffa6;
    }
    ::QVariant::toStringList();
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  QArrayDataPointer<QString>::operator=(&(this->m_fallbackDirs).d,&local_68);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
LAB_0025ffc9:
  QArrayDataPointer<QString>::QArrayDataPointer
            (&__return_storage_ptr__->d,&(this->m_fallbackDirs).d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QIconLoader::fallbackSearchPaths() const
{
    if (m_fallbackDirs.isEmpty()) {
        m_fallbackDirs = systemFallbackSearchPaths();
    }
    return m_fallbackDirs;
}